

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O3

Config * webrtc::CreateIsacConfig<webrtc::IsacFloat>
                   (Config *__return_storage_ptr__,CodecInst *codec_inst,
                   scoped_refptr<webrtc::LockedIsacBandwidthInfo> *bwinfo)

{
  int iVar1;
  LockedIsacBandwidthInfo *pLVar2;
  LockedIsacBandwidthInfo *this;
  int iVar3;
  string *result;
  int local_19c;
  FatalMessage local_198;
  
  (__return_storage_ptr__->bwinfo).ptr_ = (LockedIsacBandwidthInfo *)0x0;
  __return_storage_ptr__->payload_type = 0x67;
  __return_storage_ptr__->sample_rate_hz = 16000;
  __return_storage_ptr__->frame_size_ms = 0x1e;
  __return_storage_ptr__->bit_rate = 32000;
  __return_storage_ptr__->max_payload_size_bytes = -1;
  __return_storage_ptr__->max_bit_rate = -1;
  __return_storage_ptr__->adaptive_mode = false;
  __return_storage_ptr__->enforce_frame_size = false;
  pLVar2 = bwinfo->ptr_;
  if (pLVar2 != (LockedIsacBandwidthInfo *)0x0) {
    LOCK();
    pLVar2->ref_count_ = pLVar2->ref_count_ + 1;
    UNLOCK();
    this = (__return_storage_ptr__->bwinfo).ptr_;
    if (this != (LockedIsacBandwidthInfo *)0x0) {
      LockedIsacBandwidthInfo::Release(this);
    }
  }
  (__return_storage_ptr__->bwinfo).ptr_ = pLVar2;
  __return_storage_ptr__->payload_type = codec_inst->pltype;
  iVar1 = codec_inst->plfreq;
  __return_storage_ptr__->sample_rate_hz = iVar1;
  iVar3 = codec_inst->pacsize * 1000;
  local_198._0_4_ = iVar3 % iVar1;
  local_19c = 0;
  if (local_198._0_4_ != 0) {
    result = rtc::MakeCheckOpString<int,int>
                       ((int *)&local_198,&local_19c,"a % b == static_cast<T>(0)");
    if (result != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/checks.h"
                 ,0xdf,result);
      rtc::FatalMessage::~FatalMessage(&local_198);
    }
  }
  __return_storage_ptr__->frame_size_ms = iVar3 / iVar1;
  iVar1 = codec_inst->rate;
  __return_storage_ptr__->adaptive_mode = iVar1 == -1;
  if (iVar1 != -1) {
    __return_storage_ptr__->bit_rate = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

typename AudioEncoderIsacT<T>::Config CreateIsacConfig(
    const CodecInst& codec_inst,
    const rtc::scoped_refptr<LockedIsacBandwidthInfo>& bwinfo) {
  typename AudioEncoderIsacT<T>::Config config;
  config.bwinfo = bwinfo;
  config.payload_type = codec_inst.pltype;
  config.sample_rate_hz = codec_inst.plfreq;
  config.frame_size_ms =
      rtc::CheckedDivExact(1000 * codec_inst.pacsize, config.sample_rate_hz);
  config.adaptive_mode = (codec_inst.rate == -1);
  if (codec_inst.rate != -1)
    config.bit_rate = codec_inst.rate;
  return config;
}